

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int getFullTerritoryNameInLocaleInAlphabetUtf8
              (char *territoryName,Territory territory,int alternative,char *locale,
              Alphabet alphabet)

{
  byte bVar1;
  __int32_t *p_Var2;
  int iVar3;
  Alphabet AVar4;
  size_t sVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  char *pcVar8;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined4 in_register_00000034;
  int iVar14;
  long lVar15;
  char cVar16;
  char **ppcVar17;
  bool bVar18;
  char acStack_40 [4];
  int iStack_3c;
  undefined8 uStack_38;
  
  if (0x1b < (uint)alphabet) {
    *territoryName = '\0';
    return 0;
  }
  if (((territoryName == (char *)0x0) || (alternative < 0)) ||
     ((uint)(territory + ~TERRITORY_AAA) < 0xfffffdeb)) {
    if (territoryName != (char *)0x0) {
      *territoryName = '\0';
    }
    return 0;
  }
  iStack_3c = alternative;
  if (locale == (char *)0x0) {
    ppcVar17 = TERRITORY_FULL_NAME_LOCAL;
    uVar13 = CONCAT44(in_register_00000034,territory);
  }
  else {
    uStack_38 = CONCAT44(in_register_00000034,territory);
    sVar5 = strlen(locale);
    acStack_40[0] = '\0';
    acStack_40[1] = '\0';
    acStack_40[2] = '\0';
    acStack_40[3] = '\0';
    pcVar6 = strchr(locale,0x5f);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strchr(locale,0x2d);
    }
    iVar3 = (int)sVar5;
    if (pcVar6 != (char *)0x0) {
      iVar3 = (int)pcVar6 - (int)locale;
    }
    iVar14 = 3;
    if (iVar3 < 3) {
      iVar14 = iVar3;
    }
    memcpy(acStack_40,locale,(long)iVar14);
    acStack_40[iVar14] = '\0';
    cVar16 = acStack_40[0];
    if (acStack_40[0] != '\0') {
      pp_Var7 = __ctype_toupper_loc();
      p_Var2 = *pp_Var7;
      pcVar6 = acStack_40;
      do {
        pcVar6 = pcVar6 + 1;
        pcVar6[-1] = (char)p_Var2[cVar16];
        cVar16 = *pcVar6;
      } while (cVar16 != '\0');
    }
    lVar15 = 8;
    ppcVar17 = (char **)0x0;
    do {
      iVar3 = strcmp(*(char **)(&UNK_0024ec08 + lVar15),acStack_40);
      uVar13 = uStack_38;
      if (iVar3 == 0) {
        ppcVar17 = *(char ***)((long)&LOCALE_REGISTRY[0].locale + lVar15);
        break;
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x1b8);
  }
  if ((ppcVar17 == (char **)0x0) || (*ppcVar17 == (char *)0x0)) {
    ppcVar17 = TERRITORY_FULL_NAME_EN;
  }
  *territoryName = '\0';
  pcVar6 = ppcVar17[(int)uVar13 - 0x3e9];
  do {
    while( true ) {
      pcVar8 = strchr(pcVar6,0x7c);
      if (_ALPHABET_MIN < alphabet) break;
LAB_0016cec5:
      if (pcVar8 == (char *)0x0) {
        if (iStack_3c < 1) {
          strcpy(territoryName,pcVar6);
          return 1;
        }
        return 0;
      }
      bVar18 = iStack_3c == 0;
      iStack_3c = iStack_3c + -1;
      if (bVar18) {
        iVar14 = (int)pcVar8 - (int)pcVar6;
        iVar3 = 0x6e;
        if (iVar14 < 0x6e) {
          iVar3 = iVar14;
        }
        memcpy(territoryName,pcVar6,(long)iVar3);
        territoryName[iVar3] = '\0';
        return 1;
      }
      pcVar6 = pcVar8 + 1;
    }
    pbVar10 = (byte *)territoryName;
    if (pcVar8 == (char *)0x0) {
      pcVar9 = strcpy(territoryName,pcVar6);
    }
    else {
      iVar3 = (int)pcVar8 - (int)pcVar6;
      if (0x6d < iVar3) {
        iVar3 = 0x6e;
      }
      pcVar9 = (char *)memcpy(territoryName,pcVar6,(long)iVar3);
      territoryName[iVar3] = '\0';
    }
    do {
      bVar1 = *pbVar10;
      if (bVar1 == 0) {
        AVar4 = ALPHABET_ROMAN;
        break;
      }
      if (bVar1 < 0xc0) {
        pbVar11 = pbVar10 + 1;
        bVar18 = true;
      }
      else {
        pbVar11 = pbVar10 + 2;
        if ((char)pbVar10[1] < '\0') {
          uVar12 = ((uint)bVar1 * 0x40 + (pbVar10[1] & 0x3f)) - 0x3000;
          if (0x7ff < (int)uVar12) {
            pbVar11 = pbVar10 + 3;
            uVar12 = (uVar12 * 0x40 | pbVar10[2] & 0x3f) - 0x20000;
            pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
            if (0xffff < (int)uVar12 || -1 < (char)pbVar10[2]) {
              pcVar9 = (char *)0xffffffff;
              bVar18 = false;
              goto LAB_0016ce9d;
            }
          }
          bVar18 = ""[uVar12 >> 6 & 0x3ff] == '\0';
          pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
          if (!bVar18) {
            pcVar9 = (char *)(ulong)(uint)(int)""[uVar12 >> 6 & 0x3ff];
          }
        }
        else {
          pcVar9 = (char *)0xffffffff;
          bVar18 = false;
        }
      }
LAB_0016ce9d:
      AVar4 = (Alphabet)pcVar9;
      pbVar10 = pbVar11;
    } while (bVar18);
    if (AVar4 == alphabet) goto LAB_0016cec5;
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    pcVar6 = pcVar8 + 1;
  } while( true );
}

Assistant:

int getFullTerritoryNameInLocaleInAlphabetUtf8(char *territoryName, enum Territory territory, int alternative,
                                               const char *locale, enum Alphabet alphabet) {
    ASSERT(territoryName);
    ASSERT((_TERRITORY_MIN < territory) && (territory < _TERRITORY_MAX));
    if ((alphabet <= _ALPHABET_MIN) || (alphabet >= _ALPHABET_MAX)) {
        *territoryName = 0;
        return 0;
    }
    return getFullTerritoryName_internal(territoryName, territory, alternative, locale, alphabet);
}